

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O0

void __thiscall BifFileReader<NWN::ResRef16>::ParseBifFile(BifFileReader<NWN::ResRef16> *this)

{
  runtime_error *prVar1;
  ULONGLONG UVar2;
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  *in_RDI;
  char *unaff_retaddr;
  void *in_stack_00000008;
  FileWrapper *in_stack_00000010;
  BIF_RESOURCE Key;
  unsigned_long i;
  BIF_HEADER Header;
  FileWrapper *in_stack_ffffffffffffff88;
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa8;
  uint local_48;
  uint local_44;
  uint local_40;
  ulong local_38;
  int local_1c;
  int local_18;
  uint local_14;
  uint local_c;
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  *Description;
  
  Description = in_RDI;
  FileWrapper::ReadFile(in_stack_00000010,in_stack_00000008,(size_t)unaff_retaddr,(char *)in_RDI);
  if (local_14 < 0x100000) {
    std::
    vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
    ::reserve(in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    std::
    vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
    ::reserve(in_RDI,in_stack_ffffffffffffffa8);
  }
  if (local_1c != 0x46464942) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Header.FileType is not BIFF (illegal BIF file)");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_18 != 0x20203156) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Header.Version is not V1 (illegal BIF file)");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  UVar2 = FileWrapper::GetFileSize(in_stack_ffffffffffffff88);
  if (local_c != UVar2) {
    FileWrapper::SeekOffset(in_stack_00000010,(ULONGLONG)in_stack_00000008,unaff_retaddr);
    for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
      FileWrapper::ReadFile
                (in_stack_00000010,in_stack_00000008,(size_t)unaff_retaddr,(char *)Description);
      if (local_38 != (local_48 & 0xfffff)) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Key.ID mismatch");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_44 + local_40 < local_44) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Key.Offset overflow");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((in_RDI->
          super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage <
          (pointer)((ulong)local_44 + (ulong)local_40)) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"BIF KEY entry exceeds file size");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
      ::push_back(in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void
BifFileReader< ResRefT >::ParseBifFile(
	)
/*++

Routine Description:

	This routine parses the directory structures of a BIF file and generates
	the in-memory key and resource list entry directories.

Arguments:

	None.

Return Value:

	None.  On failure, the routine raises an std::exception.

Environment:

	User mode.

--*/
{
	BIF_HEADER Header;

	m_FileWrapper.ReadFile( &Header, sizeof( Header ), "Header" );

	if (Header.VariableResourceCount < 1024 * 1024)
		m_ResDir.reserve( Header.VariableResourceCount );
	else
		m_ResDir.reserve( 1024 * 1024 );

	if (memcmp( &Header.FileType, "BIFF", 4 ))
		throw std::runtime_error( "Header.FileType is not BIFF (illegal BIF file)" );
	if (memcmp( &Header.Version, "V1  ", 4 ))
		throw std::runtime_error( "Header.Version is not V1 (illegal BIF file)" );

	if (Header.VariableTableOffset == m_FileWrapper.GetFileSize())
	{
		//Empty BIF file, skip
		return;
	}

	m_FileWrapper.SeekOffset( Header.VariableTableOffset, "VariableTableOffset" );

	for (unsigned long i = 0; i < Header.VariableResourceCount; i += 1)
	{
		BIF_RESOURCE Key;

		m_FileWrapper.ReadFile( &Key, sizeof( Key ), "Key" );

		if ((ResID) i != (ResID) (Key.ID & 0xFFFFF))
			throw std::runtime_error( "Key.ID mismatch" );

		if (Key.Offset + Key.FileSize < Key.Offset)
			throw std::runtime_error( "Key.Offset overflow" );

		if ((ULONGLONG) Key.Offset + Key.FileSize > (ULONGLONG) m_FileSize)
			throw std::runtime_error( "BIF KEY entry exceeds file size" );

		m_ResDir.push_back( Key );
	}
}